

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::prepare_atc_single_color_table(atc_match_entry *pTable,int size0,int size1,int sel)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  lVar2 = 0;
  do {
    if (0 < size0) {
      iVar5 = 0x100;
      uVar4 = 0;
      do {
        if (size0 == 0x20) {
          uVar3 = uVar4 * 8;
          uVar6 = uVar4 >> 2;
        }
        else if (size0 == 0x10) {
          uVar6 = uVar4 >> 3 | uVar4 * 2;
          uVar3 = uVar6 * 8;
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar3 = uVar4 * 4;
          uVar6 = uVar4 >> 4;
        }
        if (0 < size1) {
          iVar1 = (uVar6 | uVar3) * 5;
          uVar7 = 0;
          uVar3 = 0;
          uVar6 = 0;
          uVar10 = 0;
          do {
            uVar9 = (uint)uVar10;
            if (size1 == 0x20) {
              uVar11 = uVar9 >> 2 | uVar3;
            }
            else if (size1 == 0x10) {
              uVar11 = (uint)(uVar10 >> 3) | uVar7;
              uVar11 = (int)uVar11 >> 2 | uVar11 * 8;
            }
            else {
              uVar11 = uVar9 >> 4 | uVar6;
            }
            if (sel != 3) {
              if (sel != 1) {
                __assert_fail("sel == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x17af,
                              "void basist::prepare_atc_single_color_table(atc_match_entry *, int, int, int)"
                             );
              }
              iVar8 = uVar11 * 3 + iVar1;
              iVar12 = iVar1 + uVar11 * 3 + 7;
              if (-1 < iVar8) {
                iVar12 = iVar8;
              }
              uVar11 = iVar12 >> 3;
            }
            iVar8 = uVar11 - (int)lVar2;
            iVar12 = -iVar8;
            if (0 < iVar8) {
              iVar12 = iVar8;
            }
            if (iVar12 < iVar5) {
              pTable[lVar2].m_lo = (uint8_t)uVar4;
              pTable[lVar2].m_hi = (uint8_t)uVar10;
              iVar5 = iVar12;
            }
            uVar10 = (ulong)(uVar9 + 1);
            uVar6 = uVar6 + 4;
            uVar3 = uVar3 + 8;
            uVar7 = uVar7 + 2;
          } while (size1 != uVar9 + 1);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != size0);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static void prepare_atc_single_color_table(atc_match_entry* pTable, int size0, int size1, int sel)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size0; lo++)
			{
				int lo_e = lo;
				if (size0 == 16)
				{
					lo_e = (lo_e << 1) | (lo_e >> 3);
					lo_e = (lo_e << 3) | (lo_e >> 2);
				}
				else if (size0 == 32)
					lo_e = (lo_e << 3) | (lo_e >> 2);
				else
					lo_e = (lo_e << 2) | (lo_e >> 4);

				for (int hi = 0; hi < size1; hi++)
				{
					int hi_e = hi;
					if (size1 == 16)
					{
						// This is only for PVRTC2 - expand to 5 then 8
						hi_e = (hi_e << 1) | (hi_e >> 3);
						hi_e = (hi_e << 3) | (hi_e >> 2);
					}
					else if (size1 == 32)
						hi_e = (hi_e << 3) | (hi_e >> 2);
					else
						hi_e = (hi_e << 2) | (hi_e >> 4);

					int e;

					if (sel == 1)
					{
						// Selector 1
						e = abs(((lo_e * 5 + hi_e * 3) / 8) - i);
					}
					else
					{
						assert(sel == 3);

						// Selector 3
						e = abs(hi_e - i);
					}

					if (e < lowest_e)
					{
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						pTable[i].m_hi = static_cast<uint8_t>(hi);

						lowest_e = e;
					}

				} // hi
			} // lo
		} // i
	}